

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

bool __thiscall GF2::VSubst<8UL>::IsBijection(VSubst<8UL> *this)

{
  word x_00;
  bool *pbVar1;
  size_t sVar2;
  undefined8 in_RDI;
  word x;
  BFunc<8UL> flags;
  undefined7 in_stack_fffffffffffffee0;
  bool in_stack_fffffffffffffee7;
  Func<8UL,_GF2::WW<8UL>_> *in_stack_fffffffffffffee8;
  ulong local_110;
  Func<8UL,_bool> local_108;
  
  BFunc<8UL>::BFunc((BFunc<8UL> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    SUB81((ulong)in_RDI >> 0x38,0));
  for (local_110 = 0; local_110 < 0x100; local_110 = local_110 + 1) {
    Func<8UL,_GF2::WW<8UL>_>::Get
              (in_stack_fffffffffffffee8,
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    x_00 = GF2::WW::operator_cast_to_unsigned_long((WW *)&stack0xfffffffffffffee8);
    pbVar1 = Func<8UL,_bool>::operator[](&local_108,x_00);
    *pbVar1 = true;
  }
  sVar2 = Func<8UL,_bool>::Count(&local_108,(bool *)&stack0xfffffffffffffee7);
  return sVar2 == 0;
}

Assistant:

bool IsBijection() const
	{	
		BFunc<_n> flags;
		for (word x = 0; x < _size; x++)
			flags[Get(x)] = true;
		return flags.Count(0) == 0;
	}